

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUdp.cpp
# Opt level: O0

void __thiscall liblogger::LogUdp::Log(LogUdp *this,LogType Type,string *str)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ostream *poVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  LogException *this_00;
  string *message;
  LogType in_ESI;
  long in_RDI;
  stringstream ss_2;
  stringstream ss_1;
  ssize_t ret;
  int len;
  stringstream ss;
  char buf [128];
  tm timeinfo;
  time_t current;
  char *msg;
  string *in_stack_fffffffffffff9a8;
  LogException *in_stack_fffffffffffff9b0;
  stringstream local_5e8 [16];
  ostream local_5d8 [383];
  undefined1 local_459;
  stringstream local_438 [16];
  ostream local_428 [376];
  ssize_t local_2b0;
  int local_2a8;
  undefined1 local_2a1;
  stringstream local_270 [16];
  ostream local_260 [376];
  char local_e8 [136];
  tm local_60;
  time_t local_28;
  char *local_20 [2];
  LogType local_c;
  
  local_20[0] = (char *)0x0;
  local_c = in_ESI;
  local_28 = time((time_t *)0x0);
  localtime_r(&local_28,&local_60);
  strftime(local_e8,0x80,"%F %T",&local_60);
  LogTypeToStr_abi_cxx11_(local_c);
  uVar3 = std::__cxx11::string::c_str();
  uVar1 = getpid();
  uVar4 = std::__cxx11::string::c_str();
  iVar2 = asprintf(local_20,"%s - %s [PID: %d] - %s\n",local_e8,uVar3,(ulong)uVar1,uVar4);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_270);
    poVar5 = std::operator<<(local_260,"asprintf failed error:");
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<(poVar5,pcVar7);
    if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
      local_2a1 = 1;
      uVar3 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      local_2a1 = 0;
      __cxa_throw(uVar3,&LogException::typeinfo,LogException::~LogException);
    }
    std::__cxx11::stringstream::~stringstream(local_270);
  }
  else {
    sVar8 = strlen(local_20[0]);
    local_2a8 = (int)sVar8;
    local_2b0 = send(*(int *)(in_RDI + 0x2c),local_20[0],(long)local_2a8,0);
    if (local_2b0 < 0) {
      std::__cxx11::stringstream::stringstream(local_438);
      poVar5 = std::operator<<(local_428,"write failed error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar5,pcVar7);
      free(local_20[0]);
      if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
        local_459 = 1;
        uVar3 = __cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        LogException::LogException(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
        local_459 = 0;
        __cxa_throw(uVar3,&LogException::typeinfo,LogException::~LogException);
      }
      std::__cxx11::stringstream::~stringstream(local_438);
    }
    else if (local_2b0 == local_2a8) {
      free(local_20[0]);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_5e8);
      this_00 = (LogException *)std::operator<<(local_5d8,"Short write only wrote ");
      message = (string *)std::ostream::operator<<(this_00,local_2b0);
      poVar5 = std::operator<<((ostream *)message," instead of ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2a8);
      poVar5 = std::operator<<(poVar5," error:");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar5,pcVar7);
      free(local_20[0]);
      if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
        uVar3 = __cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        LogException::LogException(this_00,message);
        __cxa_throw(uVar3,&LogException::typeinfo,LogException::~LogException);
      }
      std::__cxx11::stringstream::~stringstream(local_5e8);
    }
  }
  return;
}

Assistant:

void LogUdp::Log(const LogType Type, const std::string &str) {
	char *msg = NULL;

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	strftime(buf, sizeof(buf), "%F %T", &timeinfo);

	if (asprintf(&msg, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "asprintf failed error:" << strerror(errno);
		if (m_ignoreerrors)
			return;
		throw(LogException(ss.str()));
	}
	else
	{
		int len = strlen(msg);
		ssize_t ret = send(m_fd, msg, len, 0);
		if (ret < 0)
		{
			std::stringstream ss;
			ss << "write failed error:" << strerror(errno);
			free(msg);
			if (m_ignoreerrors)
				return;
			throw(LogException(ss.str()));
		}
		if (ret != len)
		{
			std::stringstream ss;
			ss << "Short write only wrote " << ret << " instead of " << len << " error:" << strerror(errno);
			free(msg);
			if (m_ignoreerrors)
				return;
			throw(LogException(ss.str()));
		}
	}
	free(msg);
}